

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall
indk::Position::setPosition(Position *this,vector<float,_std::allocator<float>_> *_X)

{
  initializer_list<float> __l;
  size_type sVar1;
  Error *pEVar2;
  reference pvVar3;
  allocator<float> local_59;
  value_type local_58;
  float local_54;
  iterator local_50;
  size_type local_48;
  vector<float,_std::allocator<float>_> local_40;
  uint local_28;
  int i;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *_X_local;
  Position *this_local;
  
  local_18 = _X;
  _X_local = (vector<float,_std::allocator<float>_> *)this;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(_X);
  if (sVar1 != this->DimensionsCount) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(pEVar2,10);
    __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
  }
  local_28 = 0;
  while( true ) {
    if (this->DimensionsCount <= local_28) {
      return;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](_X,(long)(int)local_28);
    if (*pvVar3 <= 0.0 && *pvVar3 != 0.0) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](_X,(long)(int)local_28);
    if ((float)this->Xm < *pvVar3) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](_X,(long)(int)local_28);
    this->X[(int)local_28] = *pvVar3;
    local_28 = local_28 + 1;
  }
  pEVar2 = (Error *)__cxa_allocate_exception(0x28);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](_X,(long)(int)local_28);
  local_58 = *pvVar3;
  local_54 = (float)this->Xm;
  local_50 = &local_58;
  local_48 = 2;
  std::allocator<float>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<float,_std::allocator<float>_>::vector(&local_40,__l,&local_59);
  Error::Error(pEVar2,8,&local_40);
  __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

void indk::Position::setPosition(std::vector<float> _X) {
    if (_X.size() != DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    for (int i = 0; i < DimensionsCount; i++) {
        if (_X[i] < 0 || _X[i] > Xm) {
            throw indk::Error(indk::Error::EX_POSITION_OUT_RANGES, {_X[i], (float)Xm});
        }
        X[i] = _X[i];
    }
}